

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseResolver<QList<bool>_>::PromiseResolver
          (PromiseResolver<QList<bool>_> *this,QPromise<QList<bool>_> *promise)

{
  Data *pDVar1;
  QPromise<QList<bool>_> *pQVar2;
  
  pDVar1 = (Data *)operator_new(0x10);
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar1->promise = (QPromise<QList<bool>_> *)0x0;
  (this->m_d).d = pDVar1;
  LOCK();
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar2 = (QPromise<QList<bool>_> *)operator_new(0x10);
  (pQVar2->super_QPromiseBase<QList<bool>_>).m_d.d =
       (promise->super_QPromiseBase<QList<bool>_>).m_d.d;
  (promise->super_QPromiseBase<QList<bool>_>).m_d.d = (PromiseData<QList<bool>_> *)0x0;
  (pQVar2->super_QPromiseBase<QList<bool>_>)._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00135698;
  ((this->m_d).d)->promise = pQVar2;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }